

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

bool __thiscall cs::event_type::touch(event_type *this,void *arg)

{
  bool bVar1;
  iterator this_00;
  function<bool_(void_*)> *__args;
  function<bool_(void_*)> *listener;
  iterator __end2;
  iterator __begin2;
  stack_type<std::function<bool_(void_*)>,_std::allocator> *__range2;
  stack_type<std::function<bool_(void_*)>,_std::allocator> *in_stack_ffffffffffffffc8;
  iterator local_28 [5];
  
  local_28[0] = stack_type<std::function<bool_(void_*)>,_std::allocator>::begin
                          (in_stack_ffffffffffffffc8);
  this_00 = stack_type<std::function<bool_(void_*)>,_std::allocator>::end(in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = stack_type<std::function<bool_(void_*)>,_std::allocator>::iterator::operator!=
                      (local_28,(iterator *)&stack0xffffffffffffffd0);
    if (!bVar1) {
      return false;
    }
    __args = stack_type<std::function<bool_(void_*)>,_std::allocator>::iterator::operator*(local_28)
    ;
    bVar1 = std::function<bool_(void_*)>::operator()(this_00.m_ptr,__args);
    if (bVar1) break;
    stack_type<std::function<bool_(void_*)>,_std::allocator>::iterator::operator++(local_28);
  }
  return true;
}

Assistant:

bool touch(void *arg)
		{
			for (auto &listener: m_listener)
				if (listener(arg))
					return true;
			return false;
		}